

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  string *text_00;
  MessageType t_00;
  bool bVar1;
  const_reference pvVar2;
  cmake *pcVar3;
  const_reference pvVar4;
  string local_108;
  cmState *local_e8;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_e0;
  PositionType local_d8;
  undefined1 local_c8 [8];
  cmOutputConverter converter;
  cmListFileContext lfc;
  cmListFileBacktrace local_50;
  string *local_20;
  string *text_local;
  cmMakefile *pcStack_10;
  MessageType t_local;
  cmMakefile *this_local;
  
  local_20 = text;
  text_local._4_4_ = t;
  pcStack_10 = this;
  bVar1 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
          empty(&this->CallStack);
  if (bVar1) {
    cmListFileContext::cmListFileContext((cmListFileContext *)&converter.LinkScriptShell);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->ListFileStack);
    std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)pvVar4);
    pcVar3 = GetCMakeInstance(this);
    bVar1 = cmake::GetIsInTryCompile(pcVar3);
    if (!bVar1) {
      local_d8 = (this->StateSnapshot).Position.Position;
      local_e8 = (this->StateSnapshot).State;
      pcStack_e0 = (this->StateSnapshot).Position.Tree;
      cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_c8,this->StateSnapshot);
      cmOutputConverter::Convert
                (&local_108,(cmOutputConverter *)local_c8,(string *)((long)&lfc.Name.field_2 + 8),
                 HOME,UNCHANGED);
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
    lfc.FilePath.field_2._8_8_ = 0;
    pcVar3 = GetCMakeInstance(this);
    cmake::IssueMessage(pcVar3,text_local._4_4_,local_20,
                        (cmListFileContext *)&converter.LinkScriptShell);
    cmListFileContext::~cmListFileContext((cmListFileContext *)&converter.LinkScriptShell);
  }
  else {
    if ((text_local._4_4_ == FATAL_ERROR) || (text_local._4_4_ == INTERNAL_ERROR)) {
      pvVar2 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
               ::back(&this->CallStack);
      cmExecutionStatus::SetNestedError(pvVar2->Status,true);
    }
    pcVar3 = GetCMakeInstance(this);
    t_00 = text_local._4_4_;
    text_00 = local_20;
    GetBacktrace(&local_50,this);
    cmake::IssueMessage(pcVar3,t_00,text_00,&local_50);
    cmListFileBacktrace::~cmListFileBacktrace(&local_50);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text) const
{
  // Collect context information.
  if(!this->CallStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->CallStack.back().Status->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->ListFileStack.back();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc);
    }
}